

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsEvaluation
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraintsValue)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  element_type *start;
  ostream *poVar4;
  char *pcVar5;
  long lVar6;
  ulong in_RCX;
  long *in_RDI;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_XMM0_Qa;
  ostringstream errorMsg;
  VectorDynSize *in_stack_000001a8;
  VectorDynSize *in_stack_000001b0;
  VectorDynSize *in_stack_000001b8;
  double in_stack_000001c0;
  ConstraintsGroup *in_stack_000001c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>
  *group;
  iterator __end2;
  iterator __begin2;
  ConstraintsGroupsMap *__range2;
  Index offset;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> constraintsEvaluation;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd08;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
  *this_00;
  VectorDynSize *in_stack_fffffffffffffd28;
  OptimalControlProblem *in_stack_fffffffffffffd30;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *this_01;
  string local_238 [32];
  string local_218 [48];
  ostringstream local_1e8 [376];
  reference local_70;
  _Self local_68;
  _Self local_60;
  long local_58;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
  *local_50;
  ulong local_30;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_> *local_18;
  byte local_1;
  
  local_30 = in_RCX;
  local_18 = in_XMM0_Qa;
  uVar3 = iDynTree::VectorDynSize::size();
  uVar2 = getConstraintsDimension(in_stack_fffffffffffffd30);
  if (uVar3 != uVar2) {
    getConstraintsDimension(in_stack_fffffffffffffd30);
    iDynTree::VectorDynSize::resize(local_30);
  }
  toEigen(in_stack_fffffffffffffd28);
  local_50 = (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
              *)0x0;
  local_58 = *in_RDI + 0x28;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                *)in_stack_fffffffffffffd08);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
              *)in_stack_fffffffffffffd08);
  do {
    bVar1 = std::operator!=(&local_60,&local_68);
    if (!bVar1) {
      local_1 = 1;
LAB_003000de:
      return (bool)(local_1 & 1);
    }
    local_70 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                            *)0x2ffe36);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ffe4f);
    start = std::
            __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2ffe57);
    this_01 = local_18;
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2ffe96);
    bVar1 = ConstraintsGroup::evaluateConstraints
                      (in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
                       in_stack_000001a8);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1e8);
      poVar4 = std::operator<<((ostream *)local_1e8,"Error while evaluating constraint ");
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2ffefa);
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2fff02);
      ConstraintsGroup::name_abi_cxx11_((ConstraintsGroup *)in_stack_fffffffffffffd08);
      poVar4 = std::operator<<(poVar4,local_218);
      std::operator<<(poVar4,".");
      std::__cxx11::string::~string(local_218);
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("OptimalControlProblem","constraintsEvaluation",pcVar5);
      std::__cxx11::string::~string(local_238);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1e8);
      goto LAB_003000de;
    }
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x30002d);
    toEigen(in_stack_fffffffffffffd28);
    this_00 = local_50;
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x30005f);
    iDynTree::VectorDynSize::size();
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    segment<unsigned_long>(this_01,(Index)start,(unsigned_long)in_stack_fffffffffffffd28);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,-1,1,false>::
    operator=(this_00,in_stack_fffffffffffffd08);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3000a8);
    lVar6 = iDynTree::VectorDynSize::size();
    local_50 = (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
                *)((long)&(local_50->
                          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_0>
                          .m_data + lVar6);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                  *)this_00);
  } while( true );
}

Assistant:

bool OptimalControlProblem::constraintsEvaluation(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &constraintsValue)
        {
            if (constraintsValue.size() != getConstraintsDimension()) {
                constraintsValue.resize(getConstraintsDimension());
            }

            Eigen::Map< Eigen::VectorXd > constraintsEvaluation = toEigen(constraintsValue);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (!(group.second->group_ptr->evaluateConstraints(time, state, control, group.second->constraintsBuffer))){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintsEvaluation", errorMsg.str().c_str());
                    return false;
                }

                constraintsEvaluation.segment(offset, group.second->constraintsBuffer.size()) = toEigen(group.second->constraintsBuffer);
                offset += group.second->constraintsBuffer.size();
            }

            return true;
        }